

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O0

HdlcByte * __thiscall
HdlcAnalyzer::ByteAsyncReadByte(HdlcByte *__return_storage_ptr__,HdlcAnalyzer *this)

{
  U8 local_59;
  undefined1 local_58 [7];
  U8 complimented;
  HdlcByte local_30;
  U64 local_18;
  U64 startSampleEsc;
  HdlcAnalyzer *this_local;
  
  startSampleEsc = (U64)this;
  ByteAsyncReadByte_(__return_storage_ptr__,this);
  if (((this->mReadingFrame & 1U) != 0) && (__return_storage_ptr__->value == '~')) {
    this->mFoundEndFlag = true;
  }
  if (((this->mReadingFrame & 1U) == 0) || (__return_storage_ptr__->value != '}')) {
    if (((this->mReadingFrame & 1U) != 0) && (__return_storage_ptr__->value != '~')) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (&this->mCurrentFrameBytes,&__return_storage_ptr__->value);
    }
  }
  else {
    local_18 = __return_storage_ptr__->startSample;
    ByteAsyncReadByte_(&local_30,this);
    __return_storage_ptr__->startSample = local_30.startSample;
    __return_storage_ptr__->endSample = local_30.endSample;
    __return_storage_ptr__->value = local_30.value;
    __return_storage_ptr__->escaped = local_30.escaped;
    *(undefined6 *)&__return_storage_ptr__->field_0x12 = local_30._18_6_;
    if (__return_storage_ptr__->value == '~') {
      CreateFrame((HdlcAnalyzer *)local_58,(U8)this,7,local_18,__return_storage_ptr__->endSample,0,
                  '\0');
      memcpy(&this->mAbtFrame,local_58,0x22);
      Frame::~Frame((Frame *)local_58);
      this->mAbortFrame = true;
    }
    else {
      local_59 = HdlcAnalyzerSettings::Bit5Inv(__return_storage_ptr__->value);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (&this->mCurrentFrameBytes,&local_59);
      __return_storage_ptr__->startSample = local_18;
      __return_storage_ptr__->escaped = true;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

HdlcByte HdlcAnalyzer::ByteAsyncReadByte()
{
    HdlcByte ret = ByteAsyncReadByte_();

    if( mReadingFrame && ( ret.value == HDLC_FLAG_VALUE ) )
    {
        mFoundEndFlag = true;
    }

    // Check for escape character
    if( mReadingFrame && ( ret.value == HDLC_ESCAPE_SEQ_VALUE ) ) // escape byte read
    {
        U64 startSampleEsc = ret.startSample;
        ret = ByteAsyncReadByte_();

        if( ret.value == HDLC_FLAG_VALUE ) // abort sequence = ESCAPE_BYTE + FLAG_BYTE (0x7D-0x7E)
        {
            // Create "Abort Frame" frame
            mAbtFrame = CreateFrame( HDLC_ABORT_SEQ, startSampleEsc, ret.endSample );
            mAbortFrame = true;
            return ret;
        }
        else
        {
            // Real data: with the bit-5 inverted (that's what we use for the crc)
            U8 complimented = HdlcAnalyzerSettings::Bit5Inv( ret.value );
            mCurrentFrameBytes.push_back( complimented );
            // ret.value = complimented;
            ret.startSample = startSampleEsc;
            ret.escaped = true;
            return ret;
        }
    }

    if( mReadingFrame && ( ret.value != HDLC_FLAG_VALUE ) )
    {
        mCurrentFrameBytes.push_back( ret.value );
    }

    return ret;
}